

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O2

Abc_Cex_t * Saig_ManCexRemap(Aig_Man_t *p,Aig_Man_t *pAbs,Abc_Cex_t *pCexAbs)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *p_00;
  int iVar3;
  Aig_Man_t *pAVar4;
  int iVar5;
  
  iVar1 = Saig_ManVerifyCex(pAbs,pCexAbs);
  if (iVar1 == 0) {
    puts("Saig_ManCexRemap(): The initial counter-example is invalid.");
  }
  p_00 = Abc_CexAlloc(p->nRegs,p->nTruePis,pCexAbs->iFrame + 1);
  iVar1 = pCexAbs->iFrame;
  p_00->iFrame = iVar1;
  p_00->iPo = pCexAbs->iPo;
  iVar5 = 0;
  do {
    if (iVar1 < iVar5) {
      pAVar4 = p;
      iVar1 = Saig_ManVerifyCex(p,p_00);
      iVar5 = (int)pAVar4;
      if (iVar1 == 0) {
        puts("Saig_ManCexRemap(): Counter-example is invalid.");
        Abc_CexFree(p_00);
        p_00 = (Abc_Cex_t *)0x0;
      }
      else {
        Abc_Print(iVar5,"Counter-example verification is successful.\n");
        Abc_Print(iVar5,"Output %d of miter \"%s\" was asserted in frame %d. \n",
                  (ulong)(uint)p_00->iPo,p->pName,(ulong)(uint)p_00->iFrame);
      }
      return p_00;
    }
    for (iVar1 = 0; iVar1 < pAbs->nTruePis; iVar1 = iVar1 + 1) {
      Vec_PtrEntry(pAbs->vCis,iVar1);
      if (iVar1 == p->nTruePis) break;
      uVar2 = pCexAbs->nPis * iVar5 + pCexAbs->nRegs + iVar1;
      if (((uint)(&pCexAbs[1].iPo)[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
        iVar3 = p_00->nPis * iVar5 + p_00->nRegs + iVar1;
        (&p_00[1].iPo)[iVar3 >> 5] = (&p_00[1].iPo)[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
      }
    }
    iVar5 = iVar5 + 1;
    iVar1 = pCexAbs->iFrame;
  } while( true );
}

Assistant:

Abc_Cex_t * Saig_ManCexRemap( Aig_Man_t * p, Aig_Man_t * pAbs, Abc_Cex_t * pCexAbs )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    int i, f;
    if ( !Saig_ManVerifyCex( pAbs, pCexAbs ) )
        printf( "Saig_ManCexRemap(): The initial counter-example is invalid.\n" );
//    else
//        printf( "Saig_ManCexRemap(): The initial counter-example is correct.\n" );
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p), Saig_ManPiNum(p), pCexAbs->iFrame+1 );
    pCex->iFrame = pCexAbs->iFrame;
    pCex->iPo    = pCexAbs->iPo;
    // copy the bit data
    for ( f = 0; f <= pCexAbs->iFrame; f++ )
    {
        Saig_ManForEachPi( pAbs, pObj, i )
        {
            if ( i == Saig_ManPiNum(p) )
                break;
            if ( Abc_InfoHasBit( pCexAbs->pData, pCexAbs->nRegs + pCexAbs->nPis * f + i ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p, pCex ) )
    {
        printf( "Saig_ManCexRemap(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    else
    {
        Abc_Print( 1, "Counter-example verification is successful.\n" );
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. \n", pCex->iPo, p->pName, pCex->iFrame );
    }
    return pCex;
}